

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O2

int __thiscall QCalendarWidget::qt_metacall(QCalendarWidget *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  Call _c_00;
  
  _id_00 = QWidget::qt_metacall(&this->super_QWidget,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    return _id_00 - 0xb;
  }
  if (_c == InvokeMetaMethod) {
    if (0x17 < _id_00) goto LAB_003a9717;
    _c_00 = InvokeMetaMethod;
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _id_00;
    }
    if (0x17 < _id_00) goto LAB_003a9717;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_003a9717:
  return _id_00 - 0x18;
}

Assistant:

int QCalendarWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 24)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 24;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 24)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 24;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 11;
    }
    return _id;
}